

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::Config_testDefaultSamplingProbability_Test::TestBody
          (Config_testDefaultSamplingProbability_Test *this)

{
  char *pcVar1;
  allocator local_426;
  allocator local_425;
  allocator local_424;
  allocator local_423;
  allocator local_422;
  allocator local_421;
  AssertionResult gtest_ar;
  duration local_410;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_408;
  string local_3e8 [32];
  string local_3c8;
  string local_3a8;
  duration local_388;
  string local_380;
  string local_360;
  double local_340;
  string local_338;
  undefined1 local_318 [40];
  duration local_2f0;
  HeadersConfig local_2e8;
  Config local_268;
  Config local_210;
  Config local_1b8;
  
  std::__cxx11::string::string((string *)&local_360,"remote",&local_421);
  std::__cxx11::string::string((string *)&local_380,"http://127.0.0.1:5778/sampling",&local_422);
  local_388.__r = 60000000000;
  samplers::Config::Config(&local_210,&local_360,0.001,&local_380,2000,&local_388);
  local_410.__r = 10000000000;
  std::__cxx11::string::string((string *)&local_3a8,"127.0.0.1:6831",&local_423);
  std::__cxx11::string::string((string *)&local_3c8,"",&local_424);
  reporters::Config::Config(&local_268,100,&local_410,false,&local_3a8,&local_3c8);
  propagation::HeadersConfig::HeadersConfig(&local_2e8);
  std::__cxx11::string::string(local_3e8,"",&local_425);
  local_318[0] = false;
  std::__cxx11::string::string((string *)(local_318 + 8),local_3e8);
  local_2f0.__r = 0;
  pcVar1 = "";
  std::__cxx11::string::string((string *)&local_338,"",&local_426);
  local_408.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Config::Config(&local_1b8,false,&local_210,&local_268,&local_2e8,(RestrictionsConfig *)local_318,
                 &local_338,&local_408);
  local_340 = local_1b8._sampler._param;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"samplers::Config::kDefaultSamplingProbability",
             "Config().sampler().param()",(double *)&samplers::Config::kDefaultSamplingProbability,
             &local_340);
  Config::~Config(&local_1b8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_408);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)(local_318 + 8));
  std::__cxx11::string::~string(local_3e8);
  propagation::HeadersConfig::~HeadersConfig(&local_2e8);
  reporters::Config::~Config(&local_268);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  samplers::Config::~Config(&local_210);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1b8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x4c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Config, testDefaultSamplingProbability)
{
    ASSERT_EQ(samplers::Config::kDefaultSamplingProbability,
              Config().sampler().param());
}